

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O0

void method_destroy(method_conflict m)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if ((*(long *)((long)in_RDI + 0x28) != 0) && (**(long **)((long)in_RDI + 0x28) != 0)) {
      (*(code *)**(undefined8 **)((long)in_RDI + 0x28))(in_RDI,*(undefined8 *)((long)in_RDI + 0x18))
      ;
    }
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      signature_destroy((signature)m);
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void method_destroy(method m)
{
	if (m)
	{
		if (m->iface && m->iface->destroy)
		{
			m->iface->destroy(m, m->impl);
		}

		if (m->s)
		{
			signature_destroy(m->s);
		}

		if (m->name)
		{
			free(m->name);
		}

		free(m);
	}
}